

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::paramsCode_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TestParams *params)

{
  ostream *poVar1;
  char *pcVar2;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_228;
  char *local_220;
  char *local_1d8;
  string local_1c0;
  undefined1 local_190 [8];
  ostringstream oss;
  TestParams *params_local;
  
  oss._368_8_ = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  if ((*(byte *)oss._368_8_ & 1) == 0) {
    local_1d8 = "2";
  }
  else {
    local_1d8 = "1";
  }
  poVar1 = std::operator<<((ostream *)local_190,local_1d8);
  pcVar2 = "";
  if ((*(byte *)(oss._368_8_ + 1) & 1) != 0) {
    pcVar2 = "v";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  pcVar2 = "";
  if ((*(byte *)(oss._368_8_ + 2) & 1) != 0) {
    pcVar2 = "f";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  pcVar2 = "";
  if ((*(byte *)(oss._368_8_ + 6) & 1) != 0) {
    pcVar2 = "p";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  pcVar2 = "";
  if ((*(byte *)(oss._368_8_ + 3) & 1) != 0) {
    pcVar2 = "u";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  pcVar2 = "";
  if ((*(byte *)(oss._368_8_ + 4) & 1) != 0) {
    pcVar2 = "s";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  pcVar2 = "";
  if ((*(byte *)(oss._368_8_ + 5) & 1) != 0) {
    pcVar2 = "c";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  de::toString<int>(&local_1c0,(int *)(oss._368_8_ + 8));
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  if (*(int *)(oss._368_8_ + 0x10) == 0) {
    local_220 = "n";
  }
  else {
    if (*(int *)(oss._368_8_ + 0x10) == 1) {
      local_228 = "l";
    }
    else {
      local_228 = "";
      if (*(int *)(oss._368_8_ + 0x10) == 2) {
        local_228 = "r";
      }
    }
    local_220 = local_228;
  }
  poVar1 = std::operator<<(poVar1,local_220);
  if (*(int *)(oss._368_8_ + 0x14) == 0) {
    local_238 = "m";
  }
  else {
    if (*(int *)(oss._368_8_ + 0x14) == 2) {
      local_240 = "e";
    }
    else {
      if (*(int *)(oss._368_8_ + 0x14) == 1) {
        local_248 = "a";
      }
      else {
        if (*(int *)(oss._368_8_ + 0x14) == 4) {
          local_250 = "r";
        }
        else {
          local_250 = "o";
        }
        local_248 = local_250;
      }
      local_240 = local_248;
    }
    local_238 = local_240;
  }
  poVar1 = std::operator<<(poVar1,local_238);
  if (*(int *)(oss._368_8_ + 0x18) == 0) {
    local_260 = "m";
  }
  else {
    if (*(int *)(oss._368_8_ + 0x18) == 2) {
      local_268 = "e";
    }
    else {
      if (*(int *)(oss._368_8_ + 0x18) == 1) {
        local_270 = "a";
      }
      else {
        if (*(int *)(oss._368_8_ + 0x18) == 4) {
          local_278 = "r";
        }
        else {
          local_278 = "o";
        }
        local_270 = local_278;
      }
      local_268 = local_270;
    }
    local_260 = local_268;
  }
  std::operator<<(poVar1,local_260);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

string paramsCode (const TestParams& params)
{
	using namespace glu;

	ostringstream oss;

	oss << (params.initSingle ? "1" : "2")
		<< (params.switchVtx ? "v" : "")
		<< (params.switchFrg ? "f" : "")
		<< (params.useProgramUniform ? "p" : "")
		<< (params.useUniform ? "u" : "")
		<< (params.useSameName ? "s" : "")
		<< (params.useCreateHelper ? "c" : "")
		 << de::toString(params.varyings.count)
		 << (params.varyings.binding == BINDING_NAME ? "n" :
			 params.varyings.binding == BINDING_LOCATION ? "l" :
			 params.varyings.binding == BINDING_LAST ? "r" :
			"")
		 << (params.varyings.vtxInterp == VARYINGINTERPOLATION_SMOOTH ? "m" :
			 params.varyings.vtxInterp == VARYINGINTERPOLATION_CENTROID ? "e" :
			 params.varyings.vtxInterp == VARYINGINTERPOLATION_FLAT ? "a" :
			 params.varyings.vtxInterp == VARYINGINTERPOLATION_RANDOM ? "r" :
			"o")
		 << (params.varyings.frgInterp == VARYINGINTERPOLATION_SMOOTH ? "m" :
			 params.varyings.frgInterp == VARYINGINTERPOLATION_CENTROID ? "e" :
			 params.varyings.frgInterp == VARYINGINTERPOLATION_FLAT ? "a" :
			 params.varyings.frgInterp == VARYINGINTERPOLATION_RANDOM ? "r" :
			"o");
	return oss.str();
}